

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
cs::translator_type::translate
          (translator_type *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *lines,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *statements,
          bool raw)

{
  _Elt_pointer pdVar1;
  method_base *pmVar2;
  method_base **ppmVar3;
  int iVar4;
  domain_type *domain_00;
  _Elt_pointer pptVar5;
  method_base **ppmVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  compile_error *pcVar7;
  method_base *pmVar8;
  context_t *pcVar9;
  _Elt_pointer __x;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_00;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_01;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_02;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_03;
  allocator_type local_251;
  context_t *local_250;
  method_base *m;
  statement_base *sptr;
  size_t local_238;
  size_t local_230;
  stack_type<cs::method_base_*,_std::allocator> methods;
  _Map_pointer local_200;
  _Elt_pointer local_1f8;
  domain_type domain;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> line;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_130;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  tmp;
  
  local_250 = context;
  std::
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::_Deque_base(&tmp.
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               );
  stack_type<cs::method_base_*,_std::allocator>::stack_type(&methods);
  __x = (lines->
        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_1f8 = (lines->
              super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_200 = (lines->
              super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_node;
  pdVar1 = (lines->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_230 = 0;
  pcVar9 = local_250;
  do {
    if (__x == pdVar1) {
      if (methods.m_current != methods.m_start) {
        pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&domain,"Lack of the \"end\" signal.",(allocator *)&line);
        compile_error::compile_error(pcVar7,(string *)&domain);
        __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      stack_type<cs::method_base_*,_std::allocator>::~stack_type(&methods);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque(&tmp);
      return;
    }
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque(&line,__x);
    pptVar5 = line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar5 = line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_238 = pptVar5[-1]->line_num;
    if (raw) {
      compiler_type::process_line
                ((((pcVar9->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&line);
    }
    m = match(this,&line);
    iVar4 = (*m->_vptr_method_base[2])(m);
    ppmVar3 = methods.m_current;
    ppmVar6 = methods.m_start;
    pmVar8 = m;
    switch(iVar4) {
    case 0:
      pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&domain,"Null type of grammar.",(allocator *)&local_130);
      compile_error::compile_error(pcVar7,(string *)&domain);
      __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
    case 1:
      sptr = (statement_base *)0x0;
      iVar4 = (*m->_vptr_method_base[3])();
      pmVar8 = m;
      if (ppmVar3 == ppmVar6) {
        if (iVar4 == 0x19) {
          pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&domain,"Hanging end statement.",(allocator *)&local_130);
          compile_error::compile_error(pcVar7,(string *)&domain);
          __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if (raw) {
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_130,&line)
          ;
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_130;
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)&domain,__l_01,&local_251);
          (*pmVar8->_vptr_method_base[4])(pmVar8,local_250,&domain);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                    *)&domain);
          std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                    (&local_130);
        }
        pmVar8 = m;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_130,&line);
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)&local_130;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&domain,__l_02,&local_251);
        iVar4 = (*pmVar8->_vptr_method_base[5])(pmVar8,local_250,&domain);
        sptr = (statement_base *)CONCAT44(extraout_var,iVar4);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)&domain);
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                  (&local_130);
      }
      else {
        if (iVar4 == 0x19) {
          if (raw) {
            stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
            ::pop_no_return(&(((((local_250->
                                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->instance).
                               super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_runtime_type).storage.m_set);
            pcVar9 = local_250;
            domain_00 = domain_manager::get_domain
                                  (&(((((local_250->
                                        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->instance).
                                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->super_runtime_type).storage);
            domain_type::domain_type(&domain,domain_00);
            domain_manager::remove_domain
                      (&(((((pcVar9->
                            super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->instance).
                          super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_runtime_type).storage);
            ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(&methods);
            (*(*ppmVar6)->_vptr_method_base[6])(*ppmVar6,pcVar9,&domain);
            domain_type::~domain_type(&domain);
          }
          ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(&methods);
          pmVar8 = *ppmVar6;
          stack_type<cs::method_base_*,_std::allocator>::pop(&methods);
        }
        else {
          pmVar8 = (method_base *)0x0;
        }
        pmVar2 = m;
        if (methods.m_current == methods.m_start) {
          iVar4 = (*m->_vptr_method_base[3])();
          if (iVar4 == 0x19) {
            local_238 = local_230;
            iVar4 = (*m->_vptr_method_base[7])(m,pmVar8,local_250,&tmp,&line);
            sptr = (statement_base *)CONCAT44(extraout_var_00,iVar4);
          }
          else {
            local_238 = local_230;
            iVar4 = (*pmVar8->_vptr_method_base[5])(pmVar8,local_250,&tmp);
            sptr = (statement_base *)CONCAT44(extraout_var_01,iVar4);
          }
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::clear(&tmp);
          local_238 = local_230;
        }
        else {
          if (raw) {
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_130,
                       &line);
            __l_03._M_len = 1;
            __l_03._M_array = (iterator)&local_130;
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)&domain,__l_03,&local_251);
            (*pmVar2->_vptr_method_base[4])(pmVar2,local_250,&domain);
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                      *)&domain);
            std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                      (&local_130);
          }
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::push_back(&tmp,&line);
        }
      }
      pcVar9 = local_250;
      if (sptr != (statement_base *)0x0) {
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                  (statements,&sptr);
        pcVar9 = local_250;
      }
      break;
    case 2:
      if (methods.m_current == methods.m_start) {
        pptVar5 = line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          pptVar5 = line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_230 = pptVar5[-1]->line_num;
      }
      stack_type<cs::method_base*,std::allocator>::push<cs::method_base*&>
                ((stack_type<cs::method_base*,std::allocator> *)&methods,&m);
      if (raw) {
        domain_manager::add_domain
                  (&(((((pcVar9->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage);
        stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
        ::push<>(&(((((pcVar9->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->instance).
                    super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_runtime_type).storage.m_set);
        ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(&methods);
        pmVar8 = *ppmVar6;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_130,&line);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_130;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&domain,__l,(allocator_type *)&sptr);
        pcVar9 = local_250;
        (*pmVar8->_vptr_method_base[4])(pmVar8,local_250,&domain);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)&domain);
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                  (&local_130);
      }
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::push_back(&tmp,&line);
      break;
    case 3:
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_130,&line);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_130;
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               *)&domain,__l_00,(allocator_type *)&sptr);
      pcVar9 = local_250;
      (*pmVar8->_vptr_method_base[5])(pmVar8,local_250,&domain);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)&domain);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                (&local_130);
    }
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              (&line.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
    __x = __x + 1;
    if (__x == local_1f8) {
      __x = local_200[1];
      local_200 = local_200 + 1;
      local_1f8 = __x + 6;
    }
  } while( true );
}

Assistant:

void translator_type::translate(const context_t &context, const std::deque<std::deque<token_base *>> &lines,
	                                std::deque<statement_base *> &statements, bool raw)
	{
		std::size_t method_line_num = 0, line_num = 0;
		std::deque<std::deque<token_base *>> tmp;
		stack_type<method_base *> methods;
		for (auto &it: lines) {
			std::deque<token_base *> line = it;
			line_num = static_cast<token_endline *>(line.back())->get_line_num();
			try {
				if (raw)
					context->compiler->process_line(line);
				method_base *m = this->match(line);
				switch (m->get_type()) {
				case method_types::null:
					throw compile_error("Null type of grammar.");
					break;
				case method_types::single: {
					statement_base *sptr = nullptr;
					if (!methods.empty()) {
						method_base *expected_method = nullptr;
						if (m->get_target_type() == statement_types::end_) {
							if (raw) {
								context->instance->storage.remove_set();
								domain_type domain = std::move(context->instance->storage.get_domain());
								context->instance->storage.remove_domain();
								methods.top()->postprocess(context, domain);
							}
							expected_method = methods.top();
							methods.pop();
						}
						if (methods.empty()) {
							line_num = method_line_num;
							if (m->get_target_type() == statement_types::end_)
								sptr = static_cast<method_end *>(m)->translate_end(expected_method, context, tmp,
								        line);
							else
								sptr = expected_method->translate(context, tmp);
							tmp.clear();
						}
						else {
							if (raw)
								m->preprocess(context, {line});
							tmp.push_back(line);
						}
					}
					else {
						if (m->get_target_type() == statement_types::end_)
							throw compile_error("Hanging end statement.");
						else {
							if (raw)
								m->preprocess(context, {line});
							sptr = m->translate(context, {line});
						}
					}
					if (sptr != nullptr)
						statements.push_back(sptr);
				}
				break;
				case method_types::block: {
					if (methods.empty())
						method_line_num = static_cast<token_endline *>(line.back())->get_line_num();
					methods.push(m);
					if (raw) {
						context->instance->storage.add_domain();
						context->instance->storage.add_set();
						methods.top()->preprocess(context, {line});
					}
					tmp.push_back(line);
				}
				break;
				case method_types::jit_command:
					m->translate(context, {line});
					break;
				}
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(line_num, context->file_path, context->file_buff.at(line_num - 1), e.what());
			}
		}
		if (!methods.empty())
			throw compile_error("Lack of the \"end\" signal.");
	}